

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O0

int alsa_stream_start(cubeb_stream_conflict1 *stm)

{
  snd_pcm_state_t sVar1;
  cubeb_stream_conflict1 *in_RDI;
  int r;
  cubeb_conflict1 *ctx;
  cubeb_stream_conflict1 *stm_00;
  int local_4;
  
  if (in_RDI != (cubeb_stream_conflict1 *)0x0) {
    stm_00 = (cubeb_stream_conflict1 *)in_RDI->context;
    if (((in_RDI->stream_type != SND_PCM_STREAM_PLAYBACK) ||
        (in_RDI->other_stream == (cubeb_stream_conflict1 *)0x0)) ||
       (local_4 = alsa_stream_start(stm_00), local_4 == 0)) {
      pthread_mutex_lock((pthread_mutex_t *)&in_RDI->mutex);
      if ((in_RDI->stream_type == SND_PCM_STREAM_CAPTURE) &&
         (sVar1 = (*cubeb_snd_pcm_state)(in_RDI->pcm), sVar1 == SND_PCM_STATE_PREPARED)) {
        (*cubeb_snd_pcm_start)(in_RDI->pcm);
      }
      (*cubeb_snd_pcm_pause)(in_RDI->pcm,0);
      gettimeofday((timeval *)&in_RDI->last_activity,(__timezone_ptr_t)0x0);
      pthread_mutex_unlock((pthread_mutex_t *)&in_RDI->mutex);
      pthread_mutex_lock((pthread_mutex_t *)((long)&stm_00->mutex + 8));
      if (in_RDI->state == INACTIVE) {
        alsa_set_stream_state(in_RDI,(stream_state)((ulong)stm_00 >> 0x20));
        pthread_mutex_unlock((pthread_mutex_t *)((long)&stm_00->mutex + 8));
        local_4 = 0;
      }
      else {
        pthread_mutex_unlock((pthread_mutex_t *)((long)&stm_00->mutex + 8));
        local_4 = -1;
      }
    }
    return local_4;
  }
  __assert_fail("stm",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/src/cubeb_alsa.c"
                ,0x502,"int alsa_stream_start(cubeb_stream *)");
}

Assistant:

static int
alsa_stream_start(cubeb_stream * stm)
{
  cubeb * ctx;

  assert(stm);
  ctx = stm->context;

  if (stm->stream_type == SND_PCM_STREAM_PLAYBACK && stm->other_stream) {
    int r = alsa_stream_start(stm->other_stream);
    if (r != CUBEB_OK)
      return r;
  }

  pthread_mutex_lock(&stm->mutex);
  /* Capture pcm must be started after initial setup/recover */
  if (stm->stream_type == SND_PCM_STREAM_CAPTURE &&
      WRAP(snd_pcm_state)(stm->pcm) == SND_PCM_STATE_PREPARED) {
    WRAP(snd_pcm_start)(stm->pcm);
  }
  WRAP(snd_pcm_pause)(stm->pcm, 0);
  gettimeofday(&stm->last_activity, NULL);
  pthread_mutex_unlock(&stm->mutex);

  pthread_mutex_lock(&ctx->mutex);
  if (stm->state != INACTIVE) {
    pthread_mutex_unlock(&ctx->mutex);
    return CUBEB_ERROR;
  }
  alsa_set_stream_state(stm, RUNNING);
  pthread_mutex_unlock(&ctx->mutex);

  return CUBEB_OK;
}